

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::CheckExtensionDeclaration
          (DescriptorBuilder *this,FieldDescriptor *field,FieldDescriptorProto *proto,
          string_view declared_full_name,string_view declared_type_name,bool is_repeated)

{
  char *pcVar1;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error;
  FunctionRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  make_error_00;
  bool bVar2;
  size_t sVar3;
  string_view element_name;
  string_view element_name_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  bool is_repeated_local;
  DescriptorBuilder *local_f0;
  FieldDescriptorProto *local_e8;
  VoidPtr local_e0;
  code *pcStack_d8;
  VoidPtr local_d0;
  code *pcStack_c8;
  string_view declared_full_name_local;
  string_view local_b0;
  string *local_a0;
  string actual_full_name;
  AlphaNum local_60;
  
  declared_full_name_local._M_str = declared_full_name._M_str;
  sVar3 = declared_full_name._M_len;
  is_repeated_local = is_repeated;
  declared_full_name_local._M_len = sVar3;
  if (declared_type_name._M_len != 0) {
    CheckExtensionDeclarationFieldType(this,field,proto,declared_type_name);
  }
  if (sVar3 != 0) {
    local_f0 = this;
    local_e8 = proto;
    local_b0 = absl::lts_20250127::NullSafeStringView(".");
    pcVar1 = (field->all_names_).payload_;
    local_60.piece_._M_len = (size_t)*(ushort *)(pcVar1 + 2);
    local_60.piece_._M_str = pcVar1 + ~local_60.piece_._M_len;
    absl::lts_20250127::StrCat_abi_cxx11_
              (&actual_full_name,(lts_20250127 *)&local_b0,&local_60,
               (AlphaNum *)local_60.piece_._M_str);
    __y._M_str = actual_full_name._M_dataplus._M_p;
    __y._M_len = actual_full_name._M_string_length;
    bVar2 = std::operator!=(declared_full_name,__y);
    if (bVar2) {
      pcVar1 = (field->all_names_).payload_;
      element_name._M_len = (ulong)*(ushort *)(pcVar1 + 2);
      element_name._M_str = pcVar1 + ~element_name._M_len;
      local_b0._M_str = (char *)&declared_full_name_local;
      local_b0._M_len = (size_t)field;
      pcStack_c8 = absl::lts_20250127::functional_internal::
                   InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::__cxx11::string>
      ;
      make_error.invoker_ =
           absl::lts_20250127::functional_internal::
           InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__0,std::__cxx11::string>
      ;
      make_error.ptr_.fun = (_func_void *)&local_b0;
      local_d0.obj = &local_b0;
      local_a0 = &actual_full_name;
      AddError(local_f0,element_name,&local_e8->super_Message,EXTENDEE,make_error);
    }
    std::__cxx11::string::~string((string *)&actual_full_name);
    proto = local_e8;
    this = local_f0;
  }
  bVar2 = FieldDescriptor::is_repeated(field);
  if (bVar2 != is_repeated) {
    pcVar1 = (field->all_names_).payload_;
    element_name_00._M_len = (ulong)*(ushort *)(pcVar1 + 2);
    element_name_00._M_str = pcVar1 + ~element_name_00._M_len;
    local_e0.obj = &local_b0;
    local_b0._M_str = &is_repeated_local;
    local_b0._M_len = (size_t)field;
    pcStack_d8 = absl::lts_20250127::functional_internal::
                 InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__1,std::__cxx11::string>
    ;
    make_error_00.invoker_ =
         absl::lts_20250127::functional_internal::
         InvokeObject<google::protobuf::DescriptorBuilder::CheckExtensionDeclaration(google::protobuf::FieldDescriptor_const&,google::protobuf::FieldDescriptorProto_const&,std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,bool)::__1,std::__cxx11::string>
    ;
    make_error_00.ptr_.obj = local_e0.obj;
    AddError(this,element_name_00,&proto->super_Message,EXTENDEE,make_error_00);
  }
  return;
}

Assistant:

void DescriptorBuilder::CheckExtensionDeclaration(
    const FieldDescriptor& field, const FieldDescriptorProto& proto,
    absl::string_view declared_full_name, absl::string_view declared_type_name,
    bool is_repeated) {
  if (!declared_type_name.empty()) {
    CheckExtensionDeclarationFieldType(field, proto, declared_type_name);
  }
  if (!declared_full_name.empty()) {
    std::string actual_full_name = absl::StrCat(".", field.full_name());
    if (declared_full_name != actual_full_name) {
      AddError(field.full_name(), proto,
               DescriptorPool::ErrorCollector::EXTENDEE, [&] {
                 return absl::Substitute(
                     "\"$0\" extension field $1 is expected to have field name "
                     "\"$2\", not \"$3\".",
                     field.containing_type()->full_name(), field.number(),
                     declared_full_name, actual_full_name);
               });
    }
  }

  if (is_repeated != field.is_repeated()) {
    AddError(field.full_name(), proto, DescriptorPool::ErrorCollector::EXTENDEE,
             [&] {
               return absl::Substitute(
                   "\"$0\" extension field $1 is expected to be $2.",
                   field.containing_type()->full_name(), field.number(),
                   is_repeated ? "repeated" : "optional");
             });
  }
}